

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

TapBranch * cfd::core::TapBranch::FromString(TapBranch *__return_storage_ptr__,string *text)

{
  char cVar1;
  ulong uVar2;
  bool bVar3;
  long lVar4;
  reference pvVar5;
  CfdException *pCVar6;
  ulong uVar7;
  string *target;
  string *target_00;
  ulong uVar8;
  TapBranch *__return_storage_ptr___00;
  char cVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  ulong local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> head;
  TapBranch branch2;
  
  lVar4 = ::std::__cxx11::string::find((char)text,0x20);
  if (lVar4 != -1) {
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&head,"Contains invalid charactor.",(allocator *)&branch2);
    CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
    __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
  }
  TapBranch(__return_storage_ptr__);
  text_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  text_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text_list.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = 0;
  uVar10 = 0;
  uVar11 = 0;
  uVar8 = 0;
  cVar9 = '\0';
  do {
    uVar2 = text->_M_string_length;
    if (uVar2 <= uVar11) {
      if (text_list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          text_list.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        FromString::anon_class_1_0_00000001::operator()
                  ((TapBranch *)&head,(anon_class_1_0_00000001 *)text,
                   text_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        operator=(__return_storage_ptr__,(TapBranch *)&head);
      }
      else {
        if (((long)text_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)text_list.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start != 0x40) || (local_140 + 1 < uVar2)) {
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&head,"Invalid tree format.",(allocator *)&branch2);
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        pvVar5 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&text_list,0);
        __return_storage_ptr___00 = (TapBranch *)&head;
        FromString::anon_class_1_0_00000001::operator()
                  (__return_storage_ptr___00,(anon_class_1_0_00000001 *)pvVar5,target);
        pvVar5 = ::std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&text_list,1);
        FromString::anon_class_1_0_00000001::operator()
                  (&branch2,(anon_class_1_0_00000001 *)pvVar5,target_00);
        if (((char)head._M_string_length == '\0') && (branch2.has_leaf_ == true)) {
          AddBranch(&branch2,(TapBranch *)&head);
          __return_storage_ptr___00 = &branch2;
        }
        else {
          AddBranch(__return_storage_ptr___00,&branch2);
        }
        operator=(__return_storage_ptr__,__return_storage_ptr___00);
        ~TapBranch(&branch2);
      }
      ~TapBranch((TapBranch *)&head);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&text_list);
      return __return_storage_ptr__;
    }
    cVar1 = (text->_M_dataplus)._M_p[uVar11];
    if (cVar1 == '}') {
      if (cVar9 == '\0') {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&head,"Invalid tree format.",(allocator *)&branch2)
        ;
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      cVar9 = cVar9 + -1;
      if (cVar9 == '\0') {
        if (uVar10 == 0) {
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string
                    ((string *)&head,"Invalid tree format. empty split block.",(allocator *)&branch2
                    );
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        if (uVar11 <= uVar10) {
          pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
          ::std::__cxx11::string::string((string *)&head,"Invalid tree item.",(allocator *)&branch2)
          ;
          CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
          __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
        }
        ::std::__cxx11::string::substr((ulong)&head,(ulong)text);
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&text_list,
                   &head);
        ::std::__cxx11::string::~string((string *)&head);
        cVar9 = '\0';
        local_140 = uVar11;
      }
    }
    else if (cVar1 == '{') {
      if (cVar9 == '\0') {
        uVar8 = uVar11 + 1;
      }
      cVar9 = cVar9 + '\x01';
      if (cVar9 == -1) {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)&head,"Invalid tree format.",(allocator *)&branch2)
        ;
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
    else if (cVar9 == '\x01' && cVar1 == ',') {
      uVar7 = uVar10;
      if (uVar10 == 0) {
        uVar7 = uVar8;
      }
      if (uVar7 + 3 < uVar2) {
        ::std::__cxx11::string::substr((ulong)&head,(ulong)text);
        cVar9 = '\x01';
        bVar12 = true;
        if (uVar11 != 0) {
          bVar12 = (text->_M_dataplus)._M_p[uVar11 - 1] != ')';
        }
        bVar3 = ::std::operator==(&head,"tl(");
        ::std::__cxx11::string::~string((string *)&head);
        if ((bVar3) && (bVar12)) goto LAB_002f081a;
      }
      if (uVar10 != 0) {
        pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string
                  ((string *)&head,"Invalid tree splitformat.",(allocator *)&branch2);
        CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,&head);
        __cxa_throw(pCVar6,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::__cxx11::string::substr((ulong)&head,(ulong)text);
      ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&text_list,
                 &head);
      ::std::__cxx11::string::~string((string *)&head);
      uVar10 = uVar11 + 1;
      cVar9 = '\x01';
    }
LAB_002f081a:
    uVar11 = uVar11 + 1;
  } while( true );
}

Assistant:

TapBranch TapBranch::FromString(const std::string& text) {
  static auto check_tapleaf_func = [](const std::string& text,
                                      TapBranch* branch) -> bool {
    if (text.size() < 6) return false;
    std::string head = text.substr(0, 3);
    if ((head == "tl(") && (*(text.end() - 1) == ')')) {
      size_t leaf_ver_offset = text.find(',');
      if (leaf_ver_offset == std::string::npos) {
        *branch = TaprootScriptTree(Script(text.substr(3, text.length() - 4)));
      } else {
        auto script_str = text.substr(3, leaf_ver_offset - 3);
        auto leaf_ver_str = text.substr(leaf_ver_offset + 1, 2);
        char* err = nullptr;
        auto leaf_version = strtol(leaf_ver_str.c_str(), &err, 16);
        if (((err != nullptr) && (*err != '\0')) || (leaf_version < 0) ||
            (leaf_version > std::numeric_limits<uint8_t>::max())) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid leaf version.");
        }
        *branch = TaprootScriptTree(
            static_cast<uint8_t>(leaf_version), Script(script_str));
      }
      return true;
    }
    return false;
  };

  static auto analyze_func = [](const std::string& target) -> TapBranch {
    TapBranch result;
    if (*target.begin() == '{') {
      result = TapBranch::FromString(target);  // analyze branch
    } else if (!check_tapleaf_func(target, &result)) {
      result = TapBranch(ByteData256(target));
    }
    return result;
  };

  static auto collect_items_func =
      [](const std::string& text) -> std::vector<std::string> {
    std::vector<std::string> result;
    uint8_t depth = 0;
    size_t start_block_index = 0;
    size_t end_block_index = 0;
    size_t split_index = 0;
    for (size_t idx = 0; idx < text.size(); ++idx) {
      const char& str = text[idx];
      if (str == '{') {
        if (depth == 0) start_block_index = idx + 1;
        ++depth;
        if (depth == std::numeric_limits<uint8_t>::max()) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
      } else if (str == '}') {
        if (depth == 0) {
          throw CfdException(
              CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
        }
        --depth;
        if (depth == 0) {
          if (split_index == 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree format. empty split block.");
          }
          end_block_index = idx;
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if (end_block_index <= offset) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError, "Invalid tree item.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
        }
      } else if (str == ',') {
        if (depth == 1) {
          size_t offset = (split_index == 0) ? start_block_index : split_index;
          if ((offset + 3) < text.size()) {
            auto head = text.substr(offset, 3);
            char prev_str = 0;
            if (idx > 0) prev_str = text[idx - 1];
            // ignore leaf ver
            if ((head == "tl(") && (prev_str != ')')) continue;
          }

          if (split_index != 0) {
            throw CfdException(
                CfdError::kCfdIllegalArgumentError,
                "Invalid tree splitformat.");
          }
          result.emplace_back(text.substr(offset, idx - offset));
          split_index = idx + 1;
        }
      }
    }

    if (result.empty()) {
      // do nothing
    } else if ((result.size() != 2) || ((end_block_index + 1) < text.size())) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid tree format.");
    }
    return result;
  };

  if (text.find(' ') != std::string::npos) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Contains invalid charactor.");
  }

  TapBranch result;
  auto text_list = collect_items_func(text);
  if (text_list.empty()) {
    result = analyze_func(text);
  } else {
    auto branch1 = analyze_func(text_list.at(0));
    auto branch2 = analyze_func(text_list.at(1));
    if ((!branch1.has_leaf_) && (branch2.has_leaf_)) {
      branch2.AddBranch(branch1);
      result = branch2;
    } else {
      branch1.AddBranch(branch2);
      result = branch1;
    }
  }

  return result;
}